

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  undefined2 uVar5;
  size_t sVar6;
  long lVar7;
  byte bVar8;
  BIT_DStream_status BVar9;
  BIT_DStream_status BVar10;
  BIT_DStream_status BVar11;
  BIT_DStream_status BVar12;
  int iVar13;
  size_t sVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  ulong uVar17;
  int iVar18;
  undefined1 *puVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 *puVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  void *pvVar30;
  undefined1 *puVar31;
  BIT_DStream_t bitD4;
  BIT_DStream_t bitD3;
  BIT_DStream_t bitD2;
  BIT_DStream_t bitD1;
  
  if (9 < cSrcSize) {
    uVar25 = (ulong)*cSrc;
    uVar26 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar17 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar21 = uVar17 + 6 + uVar25 + uVar26;
    sVar14 = 0xffffffffffffffec;
    if (uVar21 <= cSrcSize) {
      uVar5 = *(undefined2 *)((long)DTable + 2);
      sVar14 = BIT_initDStream(&bitD1,(void *)((long)cSrc + 6),uVar25);
      if (sVar14 < 0xffffffffffffff89) {
        pvVar30 = (void *)((long)cSrc + uVar25 + 6);
        sVar14 = BIT_initDStream(&bitD2,pvVar30,uVar26);
        if (sVar14 < 0xffffffffffffff89) {
          pvVar30 = (void *)((long)pvVar30 + uVar26);
          sVar14 = BIT_initDStream(&bitD3,pvVar30,uVar17);
          if ((sVar14 < 0xffffffffffffff89) &&
             (sVar14 = BIT_initDStream(&bitD4,(void *)((long)pvVar30 + uVar17),cSrcSize - uVar21),
             sVar14 < 0xffffffffffffff89)) {
            puVar2 = (undefined1 *)((long)dst + dstSize);
            uVar21 = dstSize + 3 >> 2;
            puVar3 = (undefined1 *)((long)dst + uVar21);
            puVar15 = puVar3 + uVar21;
            puVar16 = puVar15 + uVar21;
            BVar9 = BIT_reloadDStream(&bitD1);
            BVar10 = BIT_reloadDStream(&bitD2);
            BVar11 = BIT_reloadDStream(&bitD3);
            BVar12 = BIT_reloadDStream(&bitD4);
            puVar1 = puVar2 + -3;
            bVar8 = -(char)uVar5;
            lVar7 = uVar21 * 3;
            for (; (puVar31 = (undefined1 *)((long)dst + lVar7),
                   (BVar12 == BIT_DStream_unfinished && BVar11 == BIT_DStream_unfinished) &&
                   (BVar10 == BIT_DStream_unfinished && BVar9 == BIT_DStream_unfinished) &&
                   (puVar31 < puVar1)); dst = (void *)((long)dst + 4)) {
              uVar17 = (bitD1.bitContainer << ((byte)bitD1.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f);
              bVar4 = *(byte *)((long)DTable + uVar17 * 2 + 5);
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              uVar17 = (bitD2.bitContainer << ((byte)bitD2.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f);
              iVar13 = bVar4 + bitD1.bitsConsumed;
              iVar18 = *(byte *)((long)DTable + uVar17 * 2 + 5) + bitD2.bitsConsumed;
              *(undefined1 *)((long)dst + uVar21) = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              uVar17 = (bitD3.bitContainer << ((byte)bitD3.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f);
              iVar23 = *(byte *)((long)DTable + uVar17 * 2 + 5) + bitD3.bitsConsumed;
              *(undefined1 *)((long)dst + uVar21 * 2) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              uVar25 = (bitD4.bitContainer << ((byte)bitD4.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f);
              uVar26 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
              iVar24 = *(byte *)((long)DTable + uVar25 * 2 + 5) + bitD4.bitsConsumed;
              uVar17 = (bitD2.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar8 & 0x3f);
              uVar27 = (bitD3.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar8 & 0x3f);
              *(undefined1 *)((long)dst + lVar7) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar13 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar13;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              iVar18 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar18;
              *(undefined1 *)((long)dst + uVar21 + 1) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              iVar23 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + uVar21 * 2 + 1) =
                   *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
              uVar17 = (bitD4.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar8 & 0x3f);
              uVar25 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
              iVar24 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar24;
              uVar26 = (bitD2.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar8 & 0x3f);
              *(undefined1 *)((long)dst + lVar7 + 1) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              iVar13 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar18 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar18;
              uVar17 = (bitD3.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar8 & 0x3f);
              *(undefined1 *)((long)dst + uVar21 + 2) =
                   *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              iVar23 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + uVar21 * 2 + 2) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              uVar17 = (bitD4.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar8 & 0x3f);
              iVar24 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar24;
              *(undefined1 *)((long)dst + lVar7 + 2) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              uVar25 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
              uVar17 = (bitD2.bitContainer << ((byte)iVar18 & 0x3f)) >> (bVar8 & 0x3f);
              uVar26 = (bitD3.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar8 & 0x3f);
              bitD1.bitsConsumed = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              bitD2.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar18;
              *(undefined1 *)((long)dst + uVar21 + 3) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              bitD3.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + uVar21 * 2 + 3) =
                   *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar17 = (bitD4.bitContainer << ((byte)iVar24 & 0x3f)) >> (bVar8 & 0x3f);
              bitD4.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar24;
              *(undefined1 *)((long)dst + lVar7 + 3) =
                   *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
              BIT_reloadDStream(&bitD1);
              BIT_reloadDStream(&bitD2);
              BIT_reloadDStream(&bitD3);
              BIT_reloadDStream(&bitD4);
            }
            puVar22 = (undefined1 *)((long)dst + uVar21);
            puVar19 = (undefined1 *)((long)dst + uVar21 * 2);
            sVar14 = 0xffffffffffffffec;
            if (puVar19 <= puVar16 && (puVar22 <= puVar15 && dst <= puVar3)) {
              while ((BVar9 = BIT_reloadDStream(&bitD1), uVar29 = bitD1.bitsConsumed,
                     dst < puVar3 + -3 && (BVar9 == BIT_DStream_unfinished))) {
                uVar21 = (bitD1.bitContainer << ((byte)bitD1.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f)
                ;
                iVar13 = *(byte *)((long)DTable + uVar21 * 2 + 5) + bitD1.bitsConsumed;
                uVar17 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar13;
                uVar25 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
                uVar21 = (bitD1.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                bitD1.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 2 + 5) + iVar13;
                *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                dst = (void *)((long)dst + 4);
              }
              for (; dst < puVar3; dst = (void *)((long)dst + 1)) {
                uVar21 = (bitD1.bitContainer << ((byte)uVar29 & 0x3f)) >> (bVar8 & 0x3f);
                bVar4 = *(byte *)((long)DTable + uVar21 * 2 + 5);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                uVar29 = uVar29 + bVar4;
              }
              while ((BVar9 = BIT_reloadDStream(&bitD2), uVar28 = bitD2.bitsConsumed,
                     puVar22 < puVar15 + -3 && (BVar9 == BIT_DStream_unfinished))) {
                uVar21 = (bitD2.bitContainer << ((byte)bitD2.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f)
                ;
                iVar13 = *(byte *)((long)DTable + uVar21 * 2 + 5) + bitD2.bitsConsumed;
                uVar17 = (bitD2.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *puVar22 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar13;
                uVar25 = (bitD2.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar22[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
                uVar21 = (bitD2.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar22[2] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                bitD2.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 2 + 5) + iVar13;
                puVar22[3] = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                puVar22 = puVar22 + 4;
              }
              for (; puVar22 < puVar15; puVar22 = puVar22 + 1) {
                uVar21 = (bitD2.bitContainer << ((byte)uVar28 & 0x3f)) >> (bVar8 & 0x3f);
                bVar4 = *(byte *)((long)DTable + uVar21 * 2 + 5);
                *puVar22 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                uVar28 = uVar28 + bVar4;
              }
              while ((BVar9 = BIT_reloadDStream(&bitD3), uVar20 = bitD3.bitsConsumed,
                     puVar19 < puVar16 + -3 && (BVar9 == BIT_DStream_unfinished))) {
                uVar21 = (bitD3.bitContainer << ((byte)bitD3.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f)
                ;
                iVar13 = *(byte *)((long)DTable + uVar21 * 2 + 5) + bitD3.bitsConsumed;
                uVar17 = (bitD3.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *puVar19 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar13;
                uVar25 = (bitD3.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar19[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
                uVar21 = (bitD3.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar19[2] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                bitD3.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 2 + 5) + iVar13;
                puVar19[3] = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                puVar19 = puVar19 + 4;
              }
              for (; puVar19 < puVar16; puVar19 = puVar19 + 1) {
                uVar21 = (bitD3.bitContainer << ((byte)uVar20 & 0x3f)) >> (bVar8 & 0x3f);
                bVar4 = *(byte *)((long)DTable + uVar21 * 2 + 5);
                *puVar19 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                uVar20 = uVar20 + bVar4;
              }
              while ((BVar9 = BIT_reloadDStream(&bitD4), puVar31 < puVar1 &&
                     (BVar9 == BIT_DStream_unfinished))) {
                uVar21 = (bitD4.bitContainer << ((byte)bitD4.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f)
                ;
                iVar13 = *(byte *)((long)DTable + uVar21 * 2 + 5) + bitD4.bitsConsumed;
                uVar25 = (bitD4.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                *puVar31 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar13;
                uVar17 = (bitD4.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar31[1] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                iVar13 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar13;
                uVar21 = (bitD4.bitContainer << ((byte)iVar13 & 0x3f)) >> (bVar8 & 0x3f);
                puVar31[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
                bitD4.bitsConsumed = (uint)*(byte *)((long)DTable + uVar21 * 2 + 5) + iVar13;
                puVar31[3] = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
                puVar31 = puVar31 + 4;
              }
              for (; puVar31 < puVar2; puVar31 = puVar31 + 1) {
                uVar21 = (bitD4.bitContainer << ((byte)bitD4.bitsConsumed & 0x3f)) >> (bVar8 & 0x3f)
                ;
                bitD4.bitsConsumed = bitD4.bitsConsumed + *(byte *)((long)DTable + uVar21 * 2 + 5);
                *puVar31 = *(undefined1 *)((long)DTable + uVar21 * 2 + 4);
              }
              sVar6 = 0xffffffffffffffec;
              if (bitD4.bitsConsumed != 0x40) {
                dstSize = sVar6;
              }
              if (bitD4.ptr != bitD4.start) {
                dstSize = sVar6;
              }
              if (uVar20 != 0x40) {
                dstSize = sVar6;
              }
              if (bitD3.ptr != bitD3.start) {
                dstSize = sVar6;
              }
              if (uVar28 != 0x40) {
                dstSize = sVar6;
              }
              if (bitD2.ptr != bitD2.start) {
                dstSize = sVar6;
              }
              if (uVar29 != 0x40) {
                dstSize = sVar6;
              }
              sVar14 = dstSize;
              if (bitD1.ptr != bitD1.start) {
                sVar14 = sVar6;
              }
            }
          }
        }
      }
    }
    return sVar14;
  }
  return 0xffffffffffffffec;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X1_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    /* Check */
    if (cSrcSize < 10) return ERROR(corruption_detected);  /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        const void* const dtPtr = DTable + 1;
        const HUF_DEltX1* const dt = (const HUF_DEltX1*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        const size_t segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        U32 endSignal = BIT_DStream_unfinished;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;

        if (length4 > cSrcSize) return ERROR(corruption_detected);   /* overflow */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* up to 16 symbols per loop (4 symbols per stream) in 64-bit mode */
        endSignal = BIT_reloadDStream(&bitD1) | BIT_reloadDStream(&bitD2) | BIT_reloadDStream(&bitD3) | BIT_reloadDStream(&bitD4);
        while ( (endSignal==BIT_DStream_unfinished) && (op4<(oend-3)) ) {
            HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_1(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_1(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_1(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_1(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
            HUF_DECODE_SYMBOLX1_0(op1, &bitD1);
            HUF_DECODE_SYMBOLX1_0(op2, &bitD2);
            HUF_DECODE_SYMBOLX1_0(op3, &bitD3);
            HUF_DECODE_SYMBOLX1_0(op4, &bitD4);
            BIT_reloadDStream(&bitD1);
            BIT_reloadDStream(&bitD2);
            BIT_reloadDStream(&bitD3);
            BIT_reloadDStream(&bitD4);
        }

        /* check corruption */
        /* note : should not be necessary : op# advance in lock step, and we control op4.
         *        but curiously, binary generated by gcc 7.2 & 7.3 with -mbmi2 runs faster when >=1 test is present */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 supposed already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX1(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX1(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX1(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX1(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}